

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int __thiscall Fl_Type::remove(Fl_Type *this,char *__filename)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  Fl_Type *pFVar4;
  Fl_Type **ppFVar5;
  
  pFVar4 = this;
  do {
    pFVar3 = pFVar4;
    pFVar4 = pFVar3->next;
    if (pFVar4 == (Fl_Type *)0x0) break;
  } while (this->level < pFVar4->level);
  pFVar1 = this->prev;
  pFVar2 = pFVar4;
  if (pFVar1 != (Fl_Type *)0x0) {
    pFVar1->next = pFVar4;
    pFVar4 = pFVar3->next;
    pFVar2 = first;
  }
  first = pFVar2;
  ppFVar5 = &last;
  if (pFVar4 != (Fl_Type *)0x0) {
    ppFVar5 = &pFVar4->prev;
  }
  *ppFVar5 = pFVar1;
  pFVar3->next = (Fl_Type *)0x0;
  this->prev = (Fl_Type *)0x0;
  pFVar3 = this->parent;
  if (pFVar3 != (Fl_Type *)0x0) {
    (*pFVar3->_vptr_Fl_Type[10])(pFVar3,this);
  }
  this->parent = (Fl_Type *)0x0;
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  selection_changed((Fl_Type *)0x0);
  return (int)pFVar4;
}

Assistant:

Fl_Type *Fl_Type::remove() {
  Fl_Type *end = this;
  for (;;) {
    if (!end->next || end->next->level <= level) break;
    end = end->next;
  }
  if (prev) prev->next = end->next;
  else first = end->next;
  if (end->next) end->next->prev = prev;
  else last = prev;
  Fl_Type *r = end->next;
  prev = end->next = 0;
  if (parent) parent->remove_child(this);
  parent = 0;
  widget_browser->redraw();
  selection_changed(0);
  return r;
}